

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O3

_Bool monster_can_hear(monster *mon)

{
  wchar_t wVar1;
  monster *pmVar2;
  heatmap *phVar3;
  int iVar4;
  wchar_t wVar5;
  
  wVar5 = mon->race->hearing;
  wVar1 = (mon->target).midx;
  if (wVar1 == L'\xffffffff') {
    phVar3 = &cave->noise;
    wVar1 = (player->state).skills[5];
    iVar4 = (int)((ulong)((long)wVar1 * 0x55555555) >> 0x20) - wVar1;
    wVar5 = ((iVar4 >> 1) - (iVar4 >> 0x1f)) + wVar5;
  }
  else {
    if (wVar1 < L'\x01') {
      return false;
    }
    pmVar2 = cave_monster(cave,wVar1);
    phVar3 = &pmVar2->noise;
  }
  if (phVar3->grids[(mon->grid).y][(mon->grid).x] == 0) {
    return false;
  }
  return (int)(uint)phVar3->grids[(mon->grid).y][(mon->grid).x] < wVar5;
}

Assistant:

static bool monster_can_hear(struct monster *mon)
{
	int hearing = mon->race->hearing;
	struct heatmap noise_map = { 0 };

	/* Set target info */
	if (mon->target.midx == -1) {
		noise_map = cave->noise;
		hearing -= player->state.skills[SKILL_STEALTH] / 3;
	} else if (mon->target.midx > 0) {
		noise_map = cave_monster(cave, mon->target.midx)->noise;
	} else {
		return false;
	}

	/* Try and hear */
	if (noise_map.grids[mon->grid.y][mon->grid.x] == 0) {
		return false;
	}
	return hearing > noise_map.grids[mon->grid.y][mon->grid.x];
}